

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O0

void __thiscall cmQtAutoMocUic::InitJobs(cmQtAutoMocUic *this)

{
  bool bVar1;
  MocSettingsT *pMVar2;
  cmWorkerPool *pcVar3;
  BaseEvalT *pBVar4;
  cmQtAutoMocUic *this_local;
  
  pMVar2 = MocConst(this);
  if ((pMVar2->Enabled & 1U) != 0) {
    pMVar2 = MocConst(this);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&pMVar2->PredefsCmd);
    if (!bVar1) {
      pcVar3 = WorkerPool(this);
      cmWorkerPool::EmplaceJob<cmQtAutoMocUic::JobMocPredefsT>(pcVar3);
    }
  }
  pBVar4 = BaseEval(this);
  CreateParseJobs<cmQtAutoMocUic::JobParseHeaderT>(this,&pBVar4->Headers);
  pBVar4 = BaseEval(this);
  CreateParseJobs<cmQtAutoMocUic::JobParseSourceT>(this,&pBVar4->Sources);
  pcVar3 = WorkerPool(this);
  cmWorkerPool::EmplaceJob<cmQtAutoMocUic::JobEvaluateT>(pcVar3);
  return;
}

Assistant:

void cmQtAutoMocUic::InitJobs()
{
  // Add moc_predefs.h job
  if (MocConst().Enabled && !MocConst().PredefsCmd.empty()) {
    WorkerPool().EmplaceJob<JobMocPredefsT>();
  }
  // Add header parse jobs
  CreateParseJobs<JobParseHeaderT>(BaseEval().Headers);
  // Add source parse jobs
  CreateParseJobs<JobParseSourceT>(BaseEval().Sources);
  // Add evaluate job
  WorkerPool().EmplaceJob<JobEvaluateT>();
}